

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

void spawn_helper(uv_pipe_t *channel,uv_process_t *process,char *helper)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  size_t exepath_size;
  char *args [3];
  uv_stdio_container_t stdio [3];
  code *local_468;
  char *local_460;
  char **local_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  uv_stdio_container_t *puStack_438;
  undefined8 local_430;
  char exepath [1024];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,channel,1);
  if (iVar1 == 0) {
    if (channel->ipc == 0) {
      pcVar3 = "channel->ipc";
      uVar2 = 300;
    }
    else {
      iVar1 = uv_exepath(exepath);
      if (iVar1 == 0) {
        local_458 = args;
        args[2] = (char *)0x0;
        local_430 = 0;
        local_450 = 0;
        uStack_448 = 0;
        local_468 = exit_cb;
        puStack_438 = stdio;
        local_440 = 0x300000000;
        stdio[0].flags = UV_WRITABLE_PIPE|UV_READABLE_PIPE|UV_CREATE_PIPE;
        stdio[1].flags = UV_INHERIT_FD;
        stdio[1].data.fd = 1;
        args[0] = exepath;
        args[1] = helper;
        stdio[0].data = (anon_union_8_2_26168aa3_for_data)channel;
        stdio[2].flags = stdio[1].flags;
        stdio[2].data._0_4_ = stdio[1].flags;
        local_460 = exepath;
        uVar2 = uv_default_loop();
        iVar1 = uv_spawn(uVar2,process,&local_468);
        if (iVar1 == 0) {
          return;
        }
        pcVar3 = "r == 0";
        uVar2 = 0x146;
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x130;
      }
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 299;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

void spawn_helper(uv_pipe_t* channel,
                  uv_process_t* process,
                  const char* helper) {
  uv_process_options_t options;
  size_t exepath_size;
  char exepath[1024];
  char* args[3];
  int r;
  uv_stdio_container_t stdio[3];

  r = uv_pipe_init(uv_default_loop(), channel, 1);
  ASSERT(r == 0);
  ASSERT(channel->ipc);

  exepath_size = sizeof(exepath);
  r = uv_exepath(exepath, &exepath_size);
  ASSERT(r == 0);

  exepath[exepath_size] = '\0';
  args[0] = exepath;
  args[1] = (char*)helper;
  args[2] = NULL;

  memset(&options, 0, sizeof(options));
  options.file = exepath;
  options.args = args;
  options.exit_cb = exit_cb;
  options.stdio = stdio;
  options.stdio_count = ARRAY_SIZE(stdio);

  stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE | UV_WRITABLE_PIPE;
  stdio[0].data.stream = (uv_stream_t*) channel;
  stdio[1].flags = UV_INHERIT_FD;
  stdio[1].data.fd = 1;
  stdio[2].flags = UV_INHERIT_FD;
  stdio[2].data.fd = 2;

  r = uv_spawn(uv_default_loop(), process, &options);
  ASSERT(r == 0);
}